

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O0

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> *
detail::operator|(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *__return_storage_ptr__,b_str<char> *str,
                 split_helper_subroutine<detail::split_at_last,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 *info)

{
  split_helper_subroutine<detail::split_at_last,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *psVar1;
  reference pvVar2;
  long lVar3;
  string local_50 [39];
  undefined1 local_29;
  long local_28;
  size_t pos;
  split_helper_subroutine<detail::split_at_last,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *info_local;
  b_str<char> *str_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> *re;
  
  pos = (size_t)info;
  info_local = (split_helper_subroutine<detail::split_at_last,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                *)str;
  str_local = __return_storage_ptr__->_M_elems;
  local_28 = std::__cxx11::string::find_last_of((string *)str,(ulong)info);
  if (local_28 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string
              ((string *)(__return_storage_ptr__->_M_elems + 1),(string *)info_local);
  }
  else {
    local_29 = 0;
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
    ::array(__return_storage_ptr__);
    std::__cxx11::string::substr((ulong)local_50,(ulong)info_local);
    pvVar2 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
             ::operator[](__return_storage_ptr__,1);
    std::__cxx11::string::operator=((string *)pvVar2,local_50);
    std::__cxx11::string::~string(local_50);
    psVar1 = info_local;
    lVar3 = std::__cxx11::string::find_last_not_of((string *)info_local,pos);
    std::__cxx11::string::erase((ulong)psVar1,lVar3 + 1);
    psVar1 = info_local;
    pvVar2 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
             ::operator[](__return_storage_ptr__,0);
    std::__cxx11::string::operator=((string *)pvVar2,(string *)psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_last, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_last_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { {}, std::move(str) } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(pos + 1);
		str.erase(str.find_last_not_of(info.delim, pos) + 1);
		re[0] = std::move(str);
		return re;
	}